

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O1

void test_value_decimal128(void)

{
  char cVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 uVar4;
  char *suite;
  bson_decimal128_t dec;
  bson_t other;
  bson_value_t copy;
  bson_iter_t iter;
  undefined1 local_210 [16];
  TestSuite local_200;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined1 local_120 [32];
  TestSuite local_100 [4];
  
  local_190 = 0;
  uStack_188 = 0;
  local_1a0 = 0;
  uStack_198 = 0;
  local_1b0 = 0;
  uStack_1a8 = 0;
  local_1c0 = 0;
  uStack_1b8 = 0;
  local_1d0 = 0;
  uStack_1c8 = 0;
  local_200.outfile = (FILE *)0x0;
  local_200.flags = 0;
  local_200._44_4_ = 0;
  local_200.testname = (char *)0x0;
  local_200.tests = (Test *)0x0;
  local_200.prgname = (char *)0x500000003;
  local_200.name = (char *)0x5;
  suite = "123.5";
  cVar1 = bson_decimal128_from_string("123.5",local_210);
  if (cVar1 == '\0') {
LAB_00136589:
    test_value_decimal128_cold_1();
  }
  else {
    uVar2 = bson_bcon_magic();
    uVar2 = bcon_new(0,"decimal128",uVar2,0x12,local_210,0);
    suite = (char *)local_100;
    cVar1 = bson_iter_init(suite,uVar2);
    if (cVar1 == '\0') {
LAB_00136584:
      test_value_decimal128_cold_2();
      goto LAB_00136589;
    }
    suite = (char *)local_100;
    cVar1 = bson_iter_next();
    if (cVar1 == '\0') goto LAB_00136584;
    suite = (char *)local_100;
    lVar3 = bson_iter_value();
    if (lVar3 != 0) {
      bson_value_copy(lVar3,local_120);
      uVar4 = bson_iter_key(local_100);
      suite = (char *)&local_200;
      cVar1 = bson_append_value(suite,uVar4,0xffffffff,local_120);
      if (cVar1 != '\0') {
        bson_value_destroy(local_120);
        bson_destroy(uVar2);
        bson_destroy(&local_200);
        return;
      }
      goto LAB_00136593;
    }
  }
  test_value_decimal128_cold_4();
LAB_00136593:
  test_value_decimal128_cold_3();
  TestSuite_Add((TestSuite *)suite,"/version",test_bson_version);
  return;
}

Assistant:

static void
test_value_decimal128 (void)
{
   const bson_value_t *value;
   bson_value_t copy;
   bson_iter_t iter;
   bson_decimal128_t dec;
   bson_t other = BSON_INITIALIZER;
   bson_t *doc;

   BSON_ASSERT (bson_decimal128_from_string ("123.5", &dec));
   doc = BCON_NEW ("decimal128", BCON_DECIMAL128 (&dec));
   BSON_ASSERT (bson_iter_init (&iter, doc) && bson_iter_next (&iter));
   BSON_ASSERT ((value = bson_iter_value (&iter)));
   bson_value_copy (value, &copy);
   BSON_ASSERT (bson_append_value (&other, bson_iter_key (&iter), -1, &copy));

   bson_value_destroy (&copy);
   bson_destroy (doc);
   bson_destroy (&other);
}